

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void act_area(char *format,CHAR_DATA *ch,CHAR_DATA *victim)

{
  char cVar1;
  string_view fmt;
  string_view fmt_00;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  __type_conflict2 _Var5;
  DESCRIPTOR_DATA *d;
  char *point;
  char *i;
  char *str;
  CHAR_DATA *to;
  char buf2 [4608];
  char buf [4608];
  undefined7 in_stack_ffffffffffffdb48;
  undefined1 in_stack_ffffffffffffdb4f;
  CHAR_DATA *in_stack_ffffffffffffdb50;
  undefined4 in_stack_ffffffffffffdb58;
  int in_stack_ffffffffffffdb5c;
  CHAR_DATA *in_stack_ffffffffffffdb60;
  CHAR_DATA *pCVar6;
  int in_stack_ffffffffffffdb70;
  int in_stack_ffffffffffffdb74;
  int local_2488;
  int local_2484;
  int in_stack_ffffffffffffdb80;
  int in_stack_ffffffffffffdb84;
  CLogger *in_stack_ffffffffffffdb88;
  ulong uVar7;
  DESCRIPTOR_DATA *local_2440;
  char *local_2438;
  char *local_2430;
  char *local_2428;
  CHAR_DATA local_2418 [5];
  char local_1218 [4608];
  long local_18;
  long local_10;
  char *local_8;
  
  if ((in_RDI != (char *)0x0) && (*in_RDI != '\0')) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    for (local_2440 = descriptor_list; local_2440 != (DESCRIPTOR_DATA *)0x0;
        local_2440 = local_2440->next) {
      if ((((local_2440->connected == 0) && (local_2440->character != (CHAR_DATA *)0x0)) &&
          (local_2440->character->in_room != (ROOM_INDEX_DATA *)0x0)) &&
         (local_2440->character->in_room->area ==
          *(AREA_DATA_conflict **)(*(long *)(local_10 + 0xa8) + 0x30))) {
        pcVar4 = (char *)local_2440->character->comm[0];
        _Var5 = std::pow<int,int>(0,0x5b23c1);
        if (((ulong)pcVar4 & (long)_Var5) == 0) {
          uVar7 = local_2440->character->in_room->room_flags[0];
          _Var5 = std::pow<int,int>(0,0x5b2403);
          if (((uVar7 & (long)_Var5) == 0) && (bVar2 = is_awake(local_2440->character), bVar2)) {
            pCVar6 = local_2440->character;
            bVar2 = is_npc((CHAR_DATA *)
                           CONCAT17(in_stack_ffffffffffffdb4f,in_stack_ffffffffffffdb48));
            if ((bVar2) || (pCVar6->desc != (DESCRIPTOR_DATA *)0x0)) {
              local_2428 = local_8;
              local_2438 = local_1218;
              while (*local_2428 != '\0') {
                if (*local_2428 == '$') {
                  pcVar3 = local_2428 + 1;
                  if ((*pcVar3 < 'A') || ('Z' < *pcVar3)) {
                    in_stack_ffffffffffffdb88 = (CLogger *)(ulong)((int)*pcVar3 - 0x65);
                    switch(in_stack_ffffffffffffdb88) {
                    case (CLogger *)0x0:
                      if (*(short *)(local_18 + 0x134) < 0) {
                        in_stack_ffffffffffffdb84 = 0;
                      }
                      else if (*(short *)(local_18 + 0x134) < 3) {
                        in_stack_ffffffffffffdb80 = (int)*(short *)(local_18 + 0x134);
                        in_stack_ffffffffffffdb84 = in_stack_ffffffffffffdb80;
                      }
                      else {
                        in_stack_ffffffffffffdb80 = 2;
                        in_stack_ffffffffffffdb84 = in_stack_ffffffffffffdb80;
                      }
                      local_2430 = act_area::he_she[in_stack_ffffffffffffdb84];
                      break;
                    default:
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffdb60,
                                 (char *)CONCAT44(in_stack_ffffffffffffdb5c,
                                                  in_stack_ffffffffffffdb58));
                      fmt_00._M_str = pcVar4;
                      fmt_00._M_len = uVar7;
                      CLogger::Warn<char_const&>
                                (in_stack_ffffffffffffdb88,fmt_00,
                                 (char *)CONCAT44(in_stack_ffffffffffffdb84,
                                                  in_stack_ffffffffffffdb80));
                      local_2430 = " <@@@> ";
                      break;
                    case (CLogger *)0x8:
                      if (*(short *)(local_18 + 0x134) < 0) {
                        local_2484 = 0;
                      }
                      else {
                        if (*(short *)(local_18 + 0x134) < 3) {
                          local_2488 = (int)*(short *)(local_18 + 0x134);
                        }
                        else {
                          local_2488 = 2;
                        }
                        local_2484 = local_2488;
                      }
                      local_2430 = act_area::him_her[local_2484];
                      break;
                    case (CLogger *)0x9:
                      local_2430 = get_descr_form((CHAR_DATA *)
                                                  CONCAT44(in_stack_ffffffffffffdb5c,
                                                           in_stack_ffffffffffffdb58),
                                                  in_stack_ffffffffffffdb50,
                                                  (bool)in_stack_ffffffffffffdb4f);
                      break;
                    case (CLogger *)0xe:
                      if (*(short *)(local_18 + 0x134) < 0) {
                        in_stack_ffffffffffffdb74 = 0;
                      }
                      else if (*(short *)(local_18 + 0x134) < 3) {
                        in_stack_ffffffffffffdb70 = (int)*(short *)(local_18 + 0x134);
                        in_stack_ffffffffffffdb74 = in_stack_ffffffffffffdb70;
                      }
                      else {
                        in_stack_ffffffffffffdb70 = 2;
                        in_stack_ffffffffffffdb74 = in_stack_ffffffffffffdb70;
                      }
                      local_2430 = act_area::his_her[in_stack_ffffffffffffdb74];
                    }
                  }
                  else {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffdb60,
                               (char *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58)
                              );
                    fmt._M_str = pcVar4;
                    fmt._M_len = uVar7;
                    CLogger::Warn<char_const&>
                              (in_stack_ffffffffffffdb88,fmt,
                               (char *)CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80)
                              );
                    local_2430 = " <@@@> ";
                  }
                  local_2428 = local_2428 + 2;
                  for (; cVar1 = *local_2430, *local_2438 = cVar1, cVar1 != '\0';
                      local_2430 = local_2430 + 1) {
                    local_2438 = local_2438 + 1;
                  }
                }
                else {
                  *local_2438 = *local_2428;
                  local_2438 = local_2438 + 1;
                  local_2428 = local_2428 + 1;
                }
              }
              *local_2438 = '\0';
              if (pCVar6->desc != (DESCRIPTOR_DATA *)0x0) {
                in_stack_ffffffffffffdb60 = local_2418;
                pCVar6 = *(CHAR_DATA **)(local_10 + 0x108);
                pcVar4 = get_char_color(pCVar6,(char *)in_stack_ffffffffffffdb60);
                sprintf((char *)in_stack_ffffffffffffdb60,"%s yells \'%s",pCVar6,pcVar4);
                if (((char)local_2418[0].next < 'a') || ('z' < (char)local_2418[0].next)) {
                  in_stack_ffffffffffffdb5c = (int)(char)local_2418[0].next;
                }
                else {
                  in_stack_ffffffffffffdb5c = (char)local_2418[0].next + -0x20;
                }
                local_2418[0].next._0_1_ = (char)in_stack_ffffffffffffdb5c;
                send_to_char((char *)in_stack_ffffffffffffdb60,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
                write_to_buffer((DESCRIPTOR_DATA *)
                                CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                                (char *)pCVar6,(int)((ulong)in_stack_ffffffffffffdb60 >> 0x20));
                in_stack_ffffffffffffdb50 = local_2418;
                pcVar4 = END_COLOR((CHAR_DATA *)
                                   CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
                sprintf((char *)in_stack_ffffffffffffdb50,"%s\'\n\r",pcVar4);
                send_to_char((char *)in_stack_ffffffffffffdb60,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void act_area(const char *format, CHAR_DATA *ch, CHAR_DATA *victim)
{
	static char *const he_she[] = {"it", "he", "she"};
	static char *const him_her[] = {"it", "him", "her"};
	static char *const his_her[] = {"its", "his", "her"};
	char buf[MAX_STRING_LENGTH], buf2[MSL];
	CHAR_DATA *to;
	const char *str;
	const char *i;
	char *point;
	DESCRIPTOR_DATA *d;

	/*
	 * Discard null and zero-length messages.
	 */
	if (format == nullptr || format[0] == '\0')
		return;

	/*colorconv(format, format, ch);*/
	for (d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character
			&& d->character->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area
			&& !IS_SET(d->character->comm, COMM_QUIET))
		{
			if (IS_SET(d->character->in_room->room_flags, ROOM_SILENCE))
				continue;

			if (!is_awake(d->character))
				continue;

			to = d->character;

			if ((!is_npc(to) && to->desc == nullptr))
				continue;

			point = buf;
			str = format;

			while (*str != '\0')
			{
				if (*str != '$')
				{
					*point++ = *str++;
					continue;
				}

				++str;

				if (*str >= 'A' && *str <= 'Z')
				{
					RS.Logger.Warn("Act: missing arg2 for code {}.", *str);
					i = " <@@@> ";
				}
				else
				{
					switch (*str)
					{
						/* Thx alex for 't' idea */
						case 'n':
							i = get_descr_form(victim, ch, false);
							break;
						case 'e':
							i = he_she[URANGE(0, victim->sex, 2)];
							break;
						case 'm':
							i = him_her[URANGE(0, victim->sex, 2)];
							break;
						case 's':
							i = his_her[URANGE(0, victim->sex, 2)];
							break;
						default:
							RS.Logger.Warn("Act: bad code {}.", *str);
							i = " <@@@> ";
							break;
					}
				}

				++str;

				while ((*point = *i) != '\0')
				{
					++point, ++i;
				}
			}

			*point = '\0';

			if (to->desc != nullptr)
			{
				sprintf(buf2, "%s yells '%s", ch->short_descr, get_char_color(to, "yells"));
				buf2[0] = UPPER(buf2[0]);
				send_to_char(buf2, to);

				write_to_buffer(to->desc, buf, point - buf);

				sprintf(buf2, "%s'\n\r", END_COLOR(to));
				send_to_char(buf2, to);
			}
		}
	}
}